

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.hpp
# Opt level: O0

shared_ptr<helics::Core> __thiscall
helics::CoreFactory::CoreTypeBuilder<helics::tcp::TcpCoreSS>::build
          (CoreTypeBuilder<helics::tcp::TcpCoreSS> *this,string_view name)

{
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::Core> *in_RDI;
  shared_ptr<helics::Core> sVar1;
  shared_ptr<helics::tcp::TcpCoreSS> *in_stack_ffffffffffffffb8;
  shared_ptr<helics::Core> *this_00;
  
  this_00 = in_RDI;
  std::make_shared<helics::tcp::TcpCoreSS,std::basic_string_view<char,std::char_traits<char>>&>
            (in_RDX);
  std::shared_ptr<helics::Core>::shared_ptr<helics::tcp::TcpCoreSS,void>
            (this_00,in_stack_ffffffffffffffb8);
  std::shared_ptr<helics::tcp::TcpCoreSS>::~shared_ptr
            ((shared_ptr<helics::tcp::TcpCoreSS> *)0x47337d);
  sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI
  ;
  return (shared_ptr<helics::Core>)
         sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<Core> build(std::string_view name) override
        {
            return std::make_shared<CoreTYPE>(name);
        }